

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O2

Region * __thiscall Region::GetFirstAncestorOfNonExceptingFinallyParent(Region *this)

{
  code *pcVar1;
  bool bVar2;
  Region *pRVar3;
  undefined4 *puVar4;
  
  while( true ) {
    if (this == (Region *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                         ,0x52,"(ancestor && !ancestor->IsNonExceptingFinally())",
                         "ancestor && !ancestor->IsNonExceptingFinally()");
      if (bVar2) {
        *puVar4 = 0;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Region.cpp"
                           ,0x59,"(ancestor)","ancestor");
        if (bVar2) {
          *puVar4 = 0;
          return (Region *)0x0;
        }
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    if (this->type != RegionTypeFinally) break;
    if (this->matchingTryRegion->matchingFinallyOnNoExceptRegion != this) goto LAB_005af0ef;
    this = this->parent;
  }
  if (this->type == RegionTypeRoot) {
    return this;
  }
LAB_005af0ef:
  pRVar3 = this->parent;
  if (pRVar3->type != RegionTypeFinally) {
    return pRVar3;
  }
  if (pRVar3->matchingTryRegion->matchingFinallyOnNoExceptRegion != pRVar3) {
    return pRVar3;
  }
  pRVar3 = GetFirstAncestorOfNonExceptingFinally(pRVar3);
  return pRVar3;
}

Assistant:

Region *
Region::GetFirstAncestorOfNonExceptingFinallyParent()
{
    Region * ancestor = this;
    while (ancestor && ancestor->IsNonExceptingFinally())
    {
        ancestor = ancestor->GetParent();
    }
    // ancestor is the first ancestor which is not a non exception finally
    Assert(ancestor && !ancestor->IsNonExceptingFinally());
    // If the ancestor's parent is a non exception finally, recurse
    if (ancestor && ancestor->GetType() != RegionTypeRoot && ancestor->GetParent()->IsNonExceptingFinally())
    {
        return ancestor->GetParent()->GetFirstAncestorOfNonExceptingFinally();
    }

    Assert(ancestor);
    // Null check added to avoid prefast warning only
    return ancestor ? (ancestor->GetType() == RegionTypeRoot ? ancestor : ancestor->GetParent()) : nullptr;
}